

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_short,unsigned_short(*&)(unsigned_short,unsigned_short)>
          (Memory *this,u32 offset,u32 addend,unsigned_short rhs,
          BinopFunc<unsigned_short,_unsigned_short> **func,unsigned_short *out)

{
  pointer puVar1;
  bool bVar2;
  unsigned_short uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  Enum EVar8;
  bool bVar9;
  
  uVar6 = (ulong)offset;
  uVar7 = (ulong)addend;
  uVar4 = uVar6 + uVar7 + 2;
  puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar2 = uVar4 <= (ulong)((long)(this->data_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
  uVar5 = addend + offset;
  bVar9 = (uVar5 & 1) == 0;
  if (bVar9 && bVar2) {
    offset = (u32)*(ushort *)(puVar1 + uVar7 + uVar6);
  }
  EVar8 = Error;
  if (bVar9 && bVar2) {
    uVar3 = (**func)((unsigned_short)offset,rhs);
    if (((uVar5 & 1) == 0) &&
       (puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,
       uVar4 <= (ulong)((long)(this->data_).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1))) {
      *(unsigned_short *)(puVar1 + uVar7 + uVar6) = uVar3;
      *out = (unsigned_short)offset;
      EVar8 = Ok;
    }
  }
  return (Result)EVar8;
}

Assistant:

Result Memory::AtomicRmw(u32 offset, u32 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}